

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall MakefileGenerator::writeSubDirs(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QStringView config;
  QArrayData *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QList<MakefileGenerator::SubTarget_*> local_68;
  QArrayData *local_50;
  storage_type_conflict *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (SubTarget **)&DAT_aaaaaaaaaaaaaaaa;
  findSubDirsSubTargets(&local_68,this);
  QTextStream::operator<<(t,"first: make_first\n");
  this_00 = this->project;
  QVar2.m_data = (storage_type *)0x7;
  QVar2.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar2);
  config.m_data = local_48;
  config.m_size = local_40;
  bVar1 = QMakeEvaluator::isActiveConfig(&this_00->super_QMakeEvaluator,config,false);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  local_80 = &(local_68.d.d)->super_QArrayData;
  local_78 = local_68.d.ptr._0_4_;
  uStack_74 = local_68.d.ptr._4_4_;
  uStack_70 = (undefined4)local_68.d.size;
  uStack_6c = local_68.d.size._4_4_;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[9])
            (this,t,&local_80,(ulong)((uint)bVar1 * 2 + 1));
  if (local_80 != (QArrayData *)0x0) {
    LOCK();
    (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_80,8,0x10);
    }
  }
  qDeleteAll<QList<MakefileGenerator::SubTarget*>::const_iterator>
            ((const_iterator)local_68.d.ptr,(const_iterator)(local_68.d.ptr + local_68.d.size));
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeSubDirs(QTextStream &t)
{
    QList<SubTarget*> targets = findSubDirsSubTargets();
    t << "first: make_first\n";
    int flags = SubTargetInstalls;
    if(project->isActiveConfig("ordered"))
        flags |= SubTargetOrdered;
    writeSubTargets(t, targets, flags);
    qDeleteAll(targets);
}